

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O2

uint8 * google::protobuf::internal::WireFormatLite::WriteGroupToArray
                  (int field_number,MessageLite *value,uint8 *target)

{
  uint8 *puVar1;
  
  puVar1 = InternalWriteGroupToArray(field_number,value,false,target);
  return puVar1;
}

Assistant:

INL static uint8* WriteGroupToArray(int field_number,
                                      const MessageLite& value, uint8* target) {
    return InternalWriteGroupToArray(field_number, value, false, target);
  }